

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void mouse_handling::onMouseMove(GLFWwindow *window,double x,double y)

{
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *v;
  float scalar;
  vec<3,_float,_(glm::qualifier)0> vVar1;
  col_type cVar2;
  vec<3,_float,_(glm::qualifier)0> local_e0;
  row_type local_d0;
  row_type local_c0;
  vec<3,_float,_(glm::qualifier)0> local_b4;
  mat<4,_4,_float,_(glm::qualifier)0> local_a8;
  undefined1 local_68 [8];
  mat3 rot;
  vec3 v2d;
  float speed_1;
  float speed;
  int windowH;
  int windowW;
  float dy;
  float dx;
  double y_local;
  double x_local;
  GLFWwindow *window_local;
  
  _dy = y;
  y_local = x;
  if ((selectedCamera == -1) && (((pressed & 1) != 0 || ((middlePressed & 1) != 0)))) {
    windowW = (int)((float)x - prevX);
    windowH = (int)((float)y - prevY);
    x_local = (double)window;
    glfwGetWindowSize(window,(int *)&speed,(int *)&speed_1);
    if ((pressed & 1) != 0) {
      for (orbitCam.heading = orbitCam.heading - ((float)windowW * 3.1415927) / (float)(int)speed;
          orbitCam.heading < 0.0; orbitCam.heading = orbitCam.heading + 6.2831855) {
      }
      for (; 6.2831855 < orbitCam.heading; orbitCam.heading = orbitCam.heading - 6.2831855) {
      }
      orbitCam.pitch = orbitCam.pitch - ((float)windowH * 3.1415927) / (float)(int)speed_1;
      orbitCam.pitch = glm::clamp<float>(orbitCam.pitch,-1.4137167,1.4137167);
    }
    scalar = orbitCam.distance;
    if ((middlePressed & 1) != 0) {
      v = &rot.value[2].field_1;
      glm::vec<3,float,(glm::qualifier)0>::vec<float,float,int>
                ((vec<3,float,(glm::qualifier)0> *)v,-(float)windowW / (float)(int)speed,
                 (float)windowH / (float)(int)speed_1,0);
      glm::eulerAngleXY<float>(&local_a8,&orbitCam.pitch,&orbitCam.heading);
      glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
                ((mat<3,_3,_float,_(glm::qualifier)0> *)local_68,&local_a8);
      vVar1 = glm::operator*(scalar,(vec<3,_float,_(glm::qualifier)0> *)v);
      local_d0.field_2 = vVar1.field_2;
      local_c0.field_2 = local_d0.field_2;
      local_d0._0_8_ = vVar1._0_8_;
      local_c0.field_0 = local_d0.field_0;
      local_c0.field_1 = local_d0.field_1;
      cVar2 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_68,&local_c0);
      local_e0._0_8_ = cVar2._0_8_;
      local_b4.field_0 = local_e0.field_0;
      local_b4.field_1 = local_e0.field_1;
      local_e0.field_2 = cVar2.field_2;
      local_b4.field_2 = local_e0.field_2;
      glm::vec<3,float,(glm::qualifier)0>::operator+=
                ((vec<3,float,(glm::qualifier)0> *)&orbitCam,&local_b4);
    }
  }
  prevX = (float)y_local;
  prevY = (float)_dy;
  return;
}

Assistant:

void onMouseMove(GLFWwindow* window, double x, double y)
    {
        if(selectedCamera == -1) // orbit camera is active
        if(pressed || middlePressed)
        {
            const float dx = (float)x - prevX;
            const float dy = (float)y - prevY;
            int windowW, windowH;
            glfwGetWindowSize(window, &windowW, &windowH);
            if(pressed)
            {
                constexpr float speed = PI;
                orbitCam.heading -= speed * dx / windowW;
                while(orbitCam.heading < 0)
                    orbitCam.heading += 2*PI;
                while(orbitCam.heading > 2*PI)
                    orbitCam.heading -= 2*PI;
                orbitCam.pitch -= speed * dy / windowH;
                orbitCam.pitch = glm::clamp(orbitCam.pitch, -0.45f*PI, +0.45f*PI);
            }
            if(middlePressed)
            {
                // center panning
                float speed = orbitCam.distance;
                const vec3 v2d = {-dx/windowW, dy/windowH, 0};
                const glm::mat3 rot = glm::eulerAngleXY(orbitCam.pitch, orbitCam.heading);
                orbitCam.center += rot * (speed * v2d);
            }
        }
        prevX = (float)x;
        prevY = (float)y;
    }